

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.cpp
# Opt level: O1

LinkerScriptToken * nextToken(void)

{
  LinkerScriptTokenAttr LVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char *pcVar8;
  ulong uVar9;
  LinkerScriptToken *extraout_RAX;
  uint uVar10;
  ulong uVar11;
  EnumSeqIterator<LinkerScriptCommand> __begin4;
  long lVar12;
  char *pcVar13;
  size_t sVar14;
  char **ppcVar15;
  SectionTypeInfo *pSVar16;
  bool bVar17;
  LinkerScriptToken *pLVar7;
  
  if (nextToken::token.type == TOKEN_STRING) {
    free(nextToken::token.attr.string);
  }
  do {
    do {
      uVar2 = nextChar();
      pLVar7 = (LinkerScriptToken *)CONCAT44(extraout_var,uVar2);
    } while (uVar2 == 9);
  } while (uVar2 == 0x20);
  if (uVar2 == 0x3b) {
    do {
      do {
        uVar2 = nextChar();
        uVar5 = uVar2 + 1;
        pLVar7 = (LinkerScriptToken *)(ulong)uVar5;
      } while (0xe < uVar5);
    } while ((0x4801U >> (uVar5 & 0x1f) & 1) == 0);
  }
  if ((int)uVar2 < 0xd) {
    if (uVar2 == 0xffffffff) {
      nextToken::token.type = TOKEN_EOF;
      return pLVar7;
    }
    if (uVar2 != 10) {
LAB_00107ff0:
      sVar14 = 8;
      uVar11 = 0;
      pcVar8 = (char *)0x0;
      do {
        if (sVar14 <= uVar11 || pcVar8 == (char *)0x0) {
          sVar14 = sVar14 * 2;
          pcVar8 = (char *)realloc(pcVar8,sVar14);
          if (pcVar8 == (char *)0x0) {
            pcVar8 = "%s: Failed to allocate memory for token";
LAB_0010827e:
            err(pcVar8,"nextToken");
          }
        }
        iVar4 = toupper(uVar2);
        pcVar8[uVar11] = (char)iVar4;
        if (uVar2 == 0) goto LAB_00108086;
        uVar2 = nextChar();
        if ((uVar2 < 0x3c) && ((0x800000100002600U >> ((ulong)uVar2 & 0x3f) & 1) != 0)) {
          ungetc(uVar2,(FILE *)linkerScript);
          uVar2 = 0;
        }
        uVar11 = uVar11 + 1;
      } while( true );
    }
  }
  else if (uVar2 != 0xd) {
    if (uVar2 == 0x22) {
      nextToken::token.type = TOKEN_STRING;
      nextToken::token.attr.string = (char *)0x0;
      sVar14 = 0x10;
      uVar11 = 0;
      do {
        iVar4 = nextChar();
        if (iVar4 < 0x22) {
          if (((iVar4 == -1) || (iVar4 == 10)) || (iVar3 = iVar4, iVar4 == 0xd)) {
LAB_0010810d:
            pcVar8 = "%s(%u): Unterminated string";
            goto LAB_00108124;
          }
        }
        else {
          iVar3 = 0;
          if ((iVar4 != 0x22) && (iVar3 = iVar4, iVar4 == 0x5c)) {
            iVar3 = nextChar();
            if (iVar3 < 0x6e) {
              if (iVar3 < 0x22) {
                if (((iVar3 == -1) || (iVar3 == 10)) || (iVar3 == 0xd)) goto LAB_0010810d;
              }
              else if ((iVar3 == 0x22) || (iVar3 == 0x5c)) goto LAB_00107f62;
LAB_00108231:
              pcVar8 = "%s(%u): Illegal character escape";
LAB_00108124:
              errx(pcVar8,linkerScriptName,(ulong)lineNo);
            }
            if (iVar3 == 0x6e) {
              iVar3 = 10;
            }
            else if (iVar3 == 0x72) {
              iVar3 = 0xd;
            }
            else {
              if (iVar3 != 0x74) goto LAB_00108231;
              iVar3 = 9;
            }
          }
        }
LAB_00107f62:
        if (nextToken::token.attr.string == (char *)0x0 || sVar14 <= uVar11) {
          sVar14 = sVar14 * 2;
          nextToken::token.attr.string = (char *)realloc(nextToken::token.attr.string,sVar14);
          if (nextToken::token.attr.string == (char *)0x0) {
            pcVar8 = "%s: Failed to allocate memory for string";
            nextToken::token.attr.string = (char *)0x0;
            goto LAB_0010827e;
          }
        }
        LVar1 = nextToken::token.attr;
        nextToken::token.attr.string[uVar11] = (char)iVar3;
        uVar11 = uVar11 + 1;
        if (iVar3 == 0) {
          return (LinkerScriptToken *)LVar1.string;
        }
      } while( true );
    }
    goto LAB_00107ff0;
  }
  nextToken::token.type = TOKEN_NEWLINE;
  if (uVar2 == 0xd) {
    iVar4 = nextChar();
    pLVar7 = (LinkerScriptToken *)CONCAT44(extraout_var_00,iVar4);
    if (iVar4 != 10) {
      iVar4 = ungetc(iVar4,(FILE *)linkerScript);
      return (LinkerScriptToken *)CONCAT44(extraout_var_01,iVar4);
    }
  }
  return pLVar7;
LAB_00108086:
  nextToken::token.type = TOKEN_INVALID;
  ppcVar15 = commands;
  lVar12 = 0;
  do {
    iVar4 = strcmp(*ppcVar15,pcVar8);
    if (iVar4 == 0) {
      nextToken::token.type = TOKEN_COMMAND;
      nextToken::token.attr.command = (int)lVar12;
      break;
    }
    lVar12 = lVar12 + 1;
    ppcVar15 = ppcVar15 + 1;
  } while (lVar12 != 3);
  if (nextToken::token.type == TOKEN_INVALID) {
    pSVar16 = sectionTypeInfo;
    lVar12 = 0;
    do {
      iVar4 = strcmp(pSVar16->name,pcVar8);
      if (iVar4 == 0) {
        nextToken::token.type = TOKEN_BANK;
        nextToken::token.attr.command = (int)lVar12;
        break;
      }
      lVar12 = lVar12 + 1;
      pSVar16 = pSVar16 + 1;
    } while (lVar12 != 8);
  }
  if ((nextToken::token.type == TOKEN_INVALID) && (iVar4 = strcmp("INCLUDE",pcVar8), iVar4 == 0)) {
    nextToken::token.type = TOKEN_INCLUDE;
  }
  if (nextToken::token.type == TOKEN_INVALID) {
    bVar17 = *pcVar8 == '$';
    uVar2 = 10;
    if (bVar17) {
      uVar2 = 0x10;
    }
    if (pcVar8[bVar17] == '\0') {
LAB_0010824d:
      errx("%s(%u): Unknown token \"%s\"",linkerScriptName,(ulong)lineNo,pcVar8);
    }
    pcVar13 = pcVar8 + bVar17;
    nextToken::token.attr.string = nextToken::token.attr.string & 0xffffffff00000000;
    uVar5 = uVar2 + ((char)uVar2 == '\0');
    iVar4 = 0;
    do {
      uVar6 = toupper((int)*pcVar13);
      uVar10 = 0;
      if ((uVar6 & 0xff) != 0x30) {
        uVar11 = 0;
        do {
          uVar9 = (ulong)uVar5;
          if ((uVar5 - 1 & 0xff) == uVar11) break;
          lVar12 = uVar11 + 1;
          uVar9 = uVar11 + 1;
          uVar11 = uVar9;
        } while ((char)uVar6 != "0123456789ABCDEF"[lVar12]);
        uVar10 = (uint)uVar9 & 0xff;
      }
      if (uVar2 == uVar10) goto LAB_0010824d;
      pcVar13 = pcVar13 + 1;
      iVar4 = iVar4 * uVar2 + uVar10;
      nextToken::token.attr.command = iVar4;
    } while (*pcVar13 != '\0');
    nextToken::token.type = TOKEN_NUMBER;
  }
  free(pcVar8);
  return extraout_RAX;
}

Assistant:

static struct LinkerScriptToken *nextToken(void)
{
	static struct LinkerScriptToken token;
	int curchar;

	// If the token has a string, make sure to avoid leaking it
	if (token.type == TOKEN_STRING)
		free(token.attr.string);

	// Skip initial whitespace...
	do
		curchar = nextChar();
	while (isWhiteSpace(curchar));

	// If this is a comment, skip to the end of the line
	if (curchar == ';') {
		do {
			curchar = nextChar();
		} while (!isNewline(curchar) && curchar != EOF);
	}

	if (curchar == EOF) {
		token.type = TOKEN_EOF;
	} else if (isNewline(curchar)) {
		// If we have a newline char, this is a newline token
		token.type = TOKEN_NEWLINE;

		if (curchar == '\r') {
			// Handle CRLF
			curchar = nextChar();
			if (curchar != '\n')
				ungetc(curchar, linkerScript);
		}
	} else if (curchar == '"') {
		// If we have a string start, this is a string
		token.type = TOKEN_STRING;
		token.attr.string = NULL; // Force initial alloc

		size_t size = 0;
		size_t capacity = 16; // Half of the default capacity

		do {
			curchar = nextChar();
			if (curchar == EOF || isNewline(curchar)) {
				errx("%s(%" PRIu32 "): Unterminated string",
				     linkerScriptName, lineNo);
			} else if (curchar == '"') {
				// Quotes force a string termination
				curchar = '\0';
			} else if (curchar == '\\') {
				// Backslashes are escape sequences
				curchar = nextChar();
				if (curchar == EOF || isNewline(curchar))
					errx("%s(%" PRIu32 "): Unterminated string",
					     linkerScriptName, lineNo);
				else if (curchar == 'n')
					curchar = '\n';
				else if (curchar == 'r')
					curchar = '\r';
				else if (curchar == 't')
					curchar = '\t';
				else if (curchar != '\\' && curchar != '"')
					errx("%s(%" PRIu32 "): Illegal character escape",
					     linkerScriptName, lineNo);
			}

			if (size >= capacity || token.attr.string == NULL) {
				capacity *= 2;
				token.attr.string = (char *)realloc(token.attr.string, capacity);
				if (!token.attr.string)
					err("%s: Failed to allocate memory for string",
					    __func__);
			}
			token.attr.string[size++] = curchar;
		} while (curchar);
	} else {
		// This is either a number, command or bank, that is: a word
		char *str = NULL;
		size_t size = 0;
		size_t capacity = 8; // Half of the default capacity

		for (;;) {
			if (size >= capacity || str == NULL) {
				capacity *= 2;
				str = (char *)realloc(str, capacity);
				if (!str)
					err("%s: Failed to allocate memory for token",
					    __func__);
			}
			str[size] = toupper(curchar);
			size++;

			if (!curchar)
				break;

			curchar = nextChar();
			// Whitespace, a newline or a comment end the token
			if (isWhiteSpace(curchar) || isNewline(curchar) || curchar == ';') {
				ungetc(curchar, linkerScript);
				curchar = '\0';
			}
		}

		token.type = TOKEN_INVALID;

		// Try to match a command
		for (enum LinkerScriptCommand i : EnumSeq(COMMAND_INVALID)) {
			if (!strcmp(commands[i], str)) {
				token.type = TOKEN_COMMAND;
				token.attr.command = i;
				break;
			}
		}

		if (token.type == TOKEN_INVALID) {
			// Try to match a bank specifier
			for (enum SectionType type : EnumSeq(SECTTYPE_INVALID)) {
				if (!strcmp(sectionTypeInfo[type].name, str)) {
					token.type = TOKEN_BANK;
					token.attr.secttype = type;
					break;
				}
			}
		}

		if (token.type == TOKEN_INVALID) {
			// Try to match an include token
			if (!strcmp("INCLUDE", str))
				token.type = TOKEN_INCLUDE;
		}

		if (token.type == TOKEN_INVALID) {
			// None of the strings matched, do we have a number?
			if (tryParseNumber(str, &token.attr.number))
				token.type = TOKEN_NUMBER;
			else
				errx("%s(%" PRIu32 "): Unknown token \"%s\"",
				     linkerScriptName, lineNo, str);
		}

		free(str);
	}

	return &token;
}